

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  uint uVar1;
  size_t sVar2;
  long in_RCX;
  ulong in_R9;
  ulong in_stack_00000008;
  size_t maxCSize;
  size_t err_code;
  size_t cSize;
  size_t in_stack_000000e8;
  void *in_stack_000000f0;
  ZSTD_CCtx_params *in_stack_000000f8;
  ZSTD_entropyCTables_t *in_stack_00000100;
  ZSTD_entropyCTables_t *in_stack_00000108;
  seqStore_t *in_stack_00000110;
  void *in_stack_00000140;
  size_t in_stack_00000148;
  int in_stack_00000150;
  size_t local_8;
  
  local_8 = ZSTD_entropyCompressSeqStore_internal
                      (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                       in_stack_000000f0,in_stack_000000e8,in_stack_00000140,in_stack_00000148,
                       in_stack_00000150);
  if (local_8 == 0) {
    local_8 = 0;
  }
  else if (local_8 == 0xffffffffffffffba && in_stack_00000008 <= in_R9) {
    local_8 = 0;
  }
  else {
    uVar1 = ERR_isError(local_8);
    if ((uVar1 == 0) &&
       (sVar2 = ZSTD_minGain(in_stack_00000008,*(ZSTD_strategy *)(in_RCX + 0x1c)),
       in_stack_00000008 - sVar2 <= local_8)) {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(
                    const seqStore_t* seqStorePtr,
                    const ZSTD_entropyCTables_t* prevEntropy,
                          ZSTD_entropyCTables_t* nextEntropy,
                    const ZSTD_CCtx_params* cctxParams,
                          void* dst, size_t dstCapacity,
                          size_t srcSize,
                          void* entropyWorkspace, size_t entropyWkspSize,
                          int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity)) {
        DEBUGLOG(4, "not enough dstCapacity (%zu) for ZSTD_entropyCompressSeqStore_internal()=> do not compress block", dstCapacity);
        return 0;  /* block not compressed */
    }
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(5, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    /* libzstd decoder before  > v1.5.4 is not compatible with compressed blocks of size ZSTD_BLOCKSIZE_MAX exactly.
     * This restriction is indirectly already fulfilled by respecting ZSTD_minGain() condition above.
     */
    assert(cSize < ZSTD_BLOCKSIZE_MAX);
    return cSize;
}